

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsl_types.h
# Opt level: O1

uint __thiscall glsl_type::arrays_of_arrays_size(glsl_type *this)

{
  uint uVar1;
  glsl_type *pgVar2;
  
  uVar1 = 0;
  if (this->field_0x4 == '\x11') {
    uVar1 = this->length;
    for (pgVar2 = (this->fields).array; pgVar2->field_0x4 == '\x11'; pgVar2 = (pgVar2->fields).array
        ) {
      uVar1 = uVar1 * pgVar2->length;
    }
  }
  return uVar1;
}

Assistant:

unsigned arrays_of_arrays_size() const
   {
      if (!is_array())
         return 0;

      unsigned size = length;
      const glsl_type *base_type = fields.array;

      while (base_type->is_array()) {
         size = size * base_type->length;
         base_type = base_type->fields.array;
      }
      return size;
   }